

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallMap.h
# Opt level: O0

void __thiscall
slang::detail::hashing::StackAllocStorage<256UL,_16UL>::deallocate
          (StackAllocStorage<256UL,_16UL> *this,char *p,size_t n)

{
  bool bVar1;
  size_t sVar2;
  size_t in_RDX;
  char *in_RSI;
  StackAllocStorage<256UL,_16UL> *in_RDI;
  
  bVar1 = isInBuffer(in_RDI,in_RSI);
  if (bVar1) {
    sVar2 = alignUp(in_RDX);
    if (in_RSI + sVar2 == in_RDI->ptr) {
      in_RDI->ptr = in_RSI;
    }
  }
  else {
    operator_delete((void *)0x69289a);
  }
  return;
}

Assistant:

void deallocate(char* p, size_t n) noexcept {
        SLANG_ASSERT(isInBuffer(ptr));
        if (isInBuffer(p)) {
            n = alignUp(n);
            if (p + n == ptr)
                ptr = p;
        }
        else {
            ::operator delete(p);
        }
    }